

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::box::parse(box *this,char *ptr)

{
  uint uVar1;
  ulong uVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  uVar1 = *(uint *)ptr;
  this->size_ = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,ptr + 4,ptr + 8);
  std::__cxx11::string::operator=((string *)&this->box_type_,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  if (this->size_ == 1) {
    uVar2 = *(ulong *)(ptr + 8);
    this->large_size_ =
         uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  }
  return;
}

Assistant:

void box::parse(char const* ptr)
	{
		size_ = fmp4_read_uint32(ptr);
		box_type_ = std::string(ptr + 4, ptr + 8);
		if (size_ == 1) {
			large_size_ = fmp4_read_uint64(ptr + 8);
		}
	}